

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O1

Vector * NDCPos2WorldPos(Vector *__return_storage_ptr__,Camera *camera,Vector ndcVec,Real depth)

{
  Matrix *b;
  Matrix *a;
  uint32_t in_ECX;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  undefined1 auStack_68 [8];
  Real _ndcPos [4] [1];
  
  _auStack_68 = ndcVec.x._0_10_ * depth._0_10_;
  _ndcPos._8_10_ = ndcVec.y._0_10_ * depth._0_10_;
  _ndcPos._24_10_ = ndcVec.z._0_10_;
  _ndcPos._40_10_ = depth._0_10_;
  b = MatrixFromArray(4,1,auStack_68);
  a = MatrixMultiplication(camera->ndc2world,b);
  MatrixGetElement((Real *)a,(Matrix *)0x0,0,in_ECX);
  *(unkbyte10 *)&__return_storage_ptr__->x = in_ST0;
  MatrixGetElement((Real *)a,(Matrix *)0x1,0,in_ECX);
  *(unkbyte10 *)&__return_storage_ptr__->y = in_ST1;
  MatrixGetElement((Real *)a,(Matrix *)0x2,0,in_ECX);
  *(unkbyte10 *)&__return_storage_ptr__->z = in_ST2;
  MatrixDestroy(a);
  MatrixDestroy(b);
  return __return_storage_ptr__;
}

Assistant:

Vector NDCPos2WorldPos(const Camera *camera, const Vector ndcVec, const Real depth) {
  Real _ndcPos[][1] = {{ndcVec.x * depth}, {ndcVec.y * depth}, {ndcVec.z}, {depth}}; // NOTE: WorldPos2NDCPos drop one element "depth" from NDC matrix so we need to estimate it
  Matrix *ndcPos = MatrixFromArray(4, 1, _ndcPos);
  Matrix *_worldPos = MatrixMultiplication(camera->ndc2world, ndcPos);
  Vector worldPos = V(MatrixGetElement(_worldPos, 0, 0), MatrixGetElement(_worldPos, 1, 0), MatrixGetElement(_worldPos, 2, 0));
  MatrixDestroy(_worldPos);
  MatrixDestroy(ndcPos);
  return worldPos;
}